

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redef_base.h
# Opt level: O3

Context __thiscall
mp::
BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
Convert<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AllDiffId>>
          (BasicFuncConstrCvt<mp::AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::AllDiffId>
                 *item,int i)

{
  double *pdVar1;
  CtxVal CVar2;
  long lVar3;
  
  CVar2 = (item->super_FunctionalConstraint).ctx.value_;
  lVar3 = (long)(item->super_FunctionalConstraint).result_var_;
  if ((CVar2 - CTX_NEG < 2) &&
     (pdVar1 = (double *)(*(long *)(*(long *)this + 0x40) + lVar3 * 8),
     *pdVar1 <= 1.0 && *pdVar1 != 1.0)) {
    ConvertCtxNeg<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::AllDiffId>>
              (this,item,i);
  }
  if (((CVar2 < (CTX_MIX|CTX_ROOT)) && ((0x16U >> (CVar2 & 0x1f) & 1) != 0)) &&
     (0.0 < *(double *)(*(long *)(*(long *)this + 0x58) + lVar3 * 8))) {
    AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::ConvertCtxPos((AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)this,item,i);
  }
  return (Context)CVar2;
}

Assistant:

Context Convert(const ItemType& item, int i) {
    auto ctx = item.GetContext();
    assert(!ctx.IsNone());
    auto rv = item.GetResultVar();
    auto bnd00 = item.GetAprioriBounds();
    if ( ctx.HasNegative() &&
         GetMC().lb(rv) < bnd00.second ) {  // Need the negative direction
      MPD( ConvertCtxNeg(item, i) );
    }
    if ( ctx.HasPositive() &&
         GetMC().ub(rv) > bnd00.first ) {   // Need the positive direction
      MPD( ConvertCtxPos(item, i) );
    }
    return ctx;        // We assume the implementation just did that
  }